

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O1

void __thiscall
AbstractModuleClient::unsubscribeFromEvent(AbstractModuleClient *this,string *origin,string *event)

{
  int iVar1;
  _Rb_tree_node_base *p_Var2;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar3;
  
  pVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::equal_range(&(this->subbedEvents)._M_t,event);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_aux(&(this->subbedEvents)._M_t,(_Base_ptr)pVar3.first._M_node,
                 (_Base_ptr)pVar3.second._M_node);
  MlmWrap::removeSubscriptions(&this->super_MlmWrap,(origin->_M_dataplus)._M_p);
  for (p_Var2 = (this->subbedEvents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->subbedEvents)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    MlmWrap::subscribeEvent(&this->super_MlmWrap,origin,(string *)(p_Var2 + 1));
  }
  iVar1 = strcmp((origin->_M_dataplus)._M_p,"Trodes");
  if (iVar1 == 0) {
    MlmWrap::subscribeStream(&this->super_MlmWrap,"Trodes","cmd");
    MlmWrap::subscribeStream(&this->super_MlmWrap,"Trodes","network_note");
    return;
  }
  return;
}

Assistant:

void AbstractModuleClient::unsubscribeFromEvent(std::string origin, std::string event){
    //remove event
    subbedEvents.erase(event);

    //remove all from origin and resubscribe to subbed events
    removeSubscriptions(origin.c_str());
    for(auto &e : subbedEvents){
        subscribeEvent(origin, e);
    }
    if(streq(origin.c_str(), TRODES_NETWORK_ID)){
        this->subscribeStream(TRODES_NETWORK_ID, TRODES_CMD);
        this->subscribeStream(TRODES_NETWORK_ID, TRODES_NETWORK_NOTIFICATION);
    }
}